

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::addPageContents
          (QPDFPageObjectHelper *this,QPDFObjectHandle *contents,bool first)

{
  QPDFObjectHandle local_40;
  undefined1 local_30 [31];
  bool first_local;
  QPDFObjectHandle *contents_local;
  QPDFPageObjectHelper *this_local;
  
  local_30[0x17] = first;
  unique0x10000090 = (element_type *)contents;
  contents_local = (QPDFObjectHandle *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_30);
  QPDFObjectHandle::QPDFObjectHandle(&local_40,contents);
  QPDFObjectHandle::addPageContents
            ((QPDFObjectHandle *)local_30,&local_40,(bool)(local_30[0x17] & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

void
QPDFPageObjectHelper::addPageContents(QPDFObjectHandle contents, bool first)
{
    oh().addPageContents(contents, first);
}